

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayAlter(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  TableCatalogEntry *pTVar1;
  pointer pCVar2;
  bool bVar3;
  int iVar4;
  AlterInfo *this_00;
  pointer this_01;
  UniqueConstraint *this_02;
  ColumnDefinition *pCVar5;
  LogicalType *__x;
  string *__x_00;
  Binder *pBVar6;
  type binder_00;
  undefined4 extraout_var;
  DatabaseInstance *pDVar7;
  IndexTypeSet *this_04;
  IndexType *pIVar8;
  pointer pLVar9;
  ColumnIndex *column_index;
  pointer pCVar10;
  ColumnListIterator CVar11;
  allocator local_2a9;
  ColumnList *local_2a8;
  undefined1 local_2a0 [32];
  TableCatalogEntry *local_280;
  _Head_base<0UL,_duckdb::Index_*,_false> local_278;
  undefined1 local_270 [8];
  shared_ptr<duckdb::Binder,_true> binder;
  CreateIndexInput input;
  vector<duckdb::ColumnIndex,_true> column_indexes;
  vector<unsigned_long,_true> column_ids;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  unbound_expressions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  vector<duckdb::LogicalType,_true> column_types;
  vector<duckdb::LogicalIndex,_true> logical_indexes;
  optional_ptr<duckdb::IndexType,_true> index_type;
  IndexBinder idx_binder;
  IndexStorageInfo index_storage_info;
  DataTable *this_03;
  
  deserializer = &this->deserializer;
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
            ((Deserializer *)local_270,(field_id_t)deserializer,(char *)0x65);
  this_00 = (AlterInfo *)
            unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::operator->
                      ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
                        *)local_270);
  bVar3 = AlterInfo::IsAddPrimaryKey(this_00);
  if (bVar3) {
    Deserializer::ReadProperty<duckdb::IndexStorageInfo>
              (&index_storage_info,&deserializer->super_Deserializer,0x66,"index_storage_info");
    ReplayIndexData(this->db,deserializer,&index_storage_info,this->deserialize_only);
    if (this->deserialize_only == false) {
      this_01 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                            *)(this_00 + 1));
      this_02 = Constraint::Cast<duckdb::UniqueConstraint>(this_01);
      local_280 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                            (this->catalog,this->context,&this_00->schema,&this_00->name,
                             (QueryErrorContext)0xffffffffffffffff);
      local_2a8 = TableCatalogEntry::GetColumns(local_280);
      Binder::CreateBinder
                ((Binder *)&binder,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,
                 REGULAR_BINDER);
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CVar11 = ColumnList::Logical(local_2a8);
      local_2a0._0_8_ = CVar11.list;
      local_2a0[8] = CVar11.physical;
      ColumnList::ColumnListIterator::begin
                ((ColumnLogicalIteratorInternal *)&idx_binder,(ColumnListIterator *)local_2a0);
      ColumnList::ColumnListIterator::end
                ((ColumnLogicalIteratorInternal *)&input,(ColumnListIterator *)local_2a0);
      while (((idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)CONCAT71(input._17_7_,input.constraint_type) ||
              ((string *)
               idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != input.name)) ||
             ((TableIOManager *)idx_binder.super_ExpressionBinder._vptr_ExpressionBinder !=
              input.table_io_manager))) {
        pCVar5 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                           ((ColumnLogicalIteratorInternal *)&idx_binder);
        __x = ColumnDefinition::Type(pCVar5);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&column_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
        __x_00 = ColumnDefinition::Name_abi_cxx11_(pCVar5);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&column_names,__x_00);
        idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((long)&(idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->_vptr_ExtraTypeInfo + 1);
      }
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
      idx_binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)&idx_binder.super_ExpressionBinder.target_type.type_info_;
      idx_binder.super_ExpressionBinder.target_type.id_ = INVALID;
      idx_binder.super_ExpressionBinder.target_type.physical_type_ = ~INVALID;
      idx_binder.super_ExpressionBinder.target_type._2_6_ = 0;
      idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((ulong)idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
           0xffffffffffffff00);
      BindContext::AddBaseTable
                (&pBVar6->bind_context,0,(string *)&idx_binder,&column_names,&column_types,
                 &column_indexes,local_280,true);
      ::std::__cxx11::string::~string((string *)&idx_binder);
      binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
      IndexBinder::IndexBinder
                (&idx_binder,binder_00,this->context,
                 (optional_ptr<duckdb::TableCatalogEntry,_true>)0x0,
                 (optional_ptr<duckdb::CreateIndexInfo,_true>)0x0);
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      UniqueConstraint::GetLogicalIndexes(&logical_indexes,this_02,local_2a8);
      for (pLVar9 = logical_indexes.
                    super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                    super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pCVar2 = column_indexes.
                   super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish, pTVar1 = local_280,
          pLVar9 != logical_indexes.
                    super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                    super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pLVar9 = pLVar9 + 1) {
        pCVar5 = ColumnList::GetColumn(local_2a8,(LogicalIndex)pLVar9->index);
        ColumnDefinition::GetName_abi_cxx11_((string *)&input,pCVar5);
        make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string,std::__cxx11::string&>
                  ((duckdb *)&column_ids,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                   &this_00->name);
        local_2a0._0_8_ =
             column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ::std::__cxx11::string::~string((string *)&input);
        ExpressionBinder::Bind
                  ((ExpressionBinder *)&input,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&idx_binder,(LogicalType *)local_2a0,false);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&unbound_expressions,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &input);
        if (input.table_io_manager != (TableIOManager *)0x0) {
          (*(input.table_io_manager)->_vptr_TableIOManager[1])();
        }
        if ((ColumnList *)local_2a0._0_8_ != (ColumnList *)0x0) {
          (**(code **)(*(long *)local_2a0._0_8_ + 8))();
        }
      }
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (pCVar10 = column_indexes.
                     super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     _M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar2;
          pCVar10 = pCVar10 + 1) {
        input.table_io_manager = (TableIOManager *)pCVar10->index;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                   (unsigned_long *)&input);
      }
      iVar4 = (*(pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0x10])(pTVar1);
      this_03 = (DataTable *)CONCAT44(extraout_var,iVar4);
      input.table_io_manager = DataTable::GetTableIOManager(this_03);
      input.db = this_03->db;
      input.options = &index_storage_info.options;
      input.constraint_type = PRIMARY;
      input.name = &index_storage_info.name;
      input.unbound_expressions = &unbound_expressions;
      input.column_ids =
           (vector<unsigned_long,_true> *)
           &column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
      input.storage_info = (IndexStorageInfo *)input.name;
      pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->context->db);
      this_04 = DBConfig::GetIndexTypes(&pDVar7->config);
      ::std::__cxx11::string::string((string *)local_2a0,"ART",&local_2a9);
      index_type = IndexTypeSet::FindByName(this_04,(string *)local_2a0);
      ::std::__cxx11::string::~string((string *)local_2a0);
      pIVar8 = optional_ptr<duckdb::IndexType,_true>::operator->(&index_type);
      (*pIVar8->create_instance)((CreateIndexInput *)local_2a0);
      local_278._M_head_impl = (Index *)local_2a0._0_8_;
      local_2a0._0_8_ = (ColumnList *)0x0;
      DataTable::AddIndex(this_03,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>
                                   *)&local_278);
      if ((ColumnList *)local_278._M_head_impl != (ColumnList *)0x0) {
        (*(code *)(((((vector<duckdb::ColumnDefinition,_true> *)
                     &(local_278._M_head_impl)->_vptr_Index)->
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ).
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start)->name)._M_string_length)();
      }
      Catalog::Alter(this->catalog,this->context,this_00);
      if ((ColumnList *)local_2a0._0_8_ != (ColumnList *)0x0) {
        (**(code **)(*(long *)local_2a0._0_8_ + 8))();
      }
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids);
      ::std::_Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::
      ~_Vector_base((_Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> *)
                    &logical_indexes);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&unbound_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               );
      ExpressionBinder::~ExpressionBinder(&idx_binder.super_ExpressionBinder);
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                (&column_indexes.
                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&column_names);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&column_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    IndexStorageInfo::~IndexStorageInfo(&index_storage_info);
  }
  else if (this->deserialize_only == false) {
    Catalog::Alter(this->catalog,this->context,this_00);
  }
  if (local_270 != (undefined1  [8])0x0) {
    (**(code **)((((string *)local_270)->_M_dataplus)._M_p + 8))();
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayAlter() {
	auto info = deserializer.ReadProperty<unique_ptr<ParseInfo>>(101, "info");
	auto &alter_info = info->Cast<AlterInfo>();
	if (!alter_info.IsAddPrimaryKey()) {
		return ReplayWithoutIndex(context, catalog, alter_info, DeserializeOnly());
	}

	auto index_storage_info = deserializer.ReadProperty<IndexStorageInfo>(102, "index_storage_info");
	ReplayIndexData(db, deserializer, index_storage_info, DeserializeOnly());
	if (DeserializeOnly()) {
		return;
	}

	auto &table_info = alter_info.Cast<AlterTableInfo>();
	auto &constraint_info = table_info.Cast<AddConstraintInfo>();
	auto &unique_info = constraint_info.constraint->Cast<UniqueConstraint>();

	auto &table =
	    catalog.GetEntry<TableCatalogEntry>(context, table_info.schema, table_info.name).Cast<DuckTableEntry>();
	auto &column_list = table.GetColumns();

	// Add the table to the bind context to bind the parsed expressions.
	auto binder = Binder::CreateBinder(context);
	vector<LogicalType> column_types;
	vector<string> column_names;
	for (auto &col : column_list.Logical()) {
		column_types.push_back(col.Type());
		column_names.push_back(col.Name());
	}

	// Create a binder to bind the parsed expressions.
	vector<ColumnIndex> column_indexes;
	binder->bind_context.AddBaseTable(0, string(), column_names, column_types, column_indexes, table);
	IndexBinder idx_binder(*binder, context);

	// Bind the parsed expressions to create unbound expressions.
	vector<unique_ptr<Expression>> unbound_expressions;
	auto logical_indexes = unique_info.GetLogicalIndexes(column_list);
	for (const auto &logical_index : logical_indexes) {
		auto &col = column_list.GetColumn(logical_index);
		unique_ptr<ParsedExpression> parsed = make_uniq<ColumnRefExpression>(col.GetName(), table_info.name);
		unbound_expressions.push_back(idx_binder.Bind(parsed));
	}

	vector<column_t> column_ids;
	for (auto &column_index : column_indexes) {
		column_ids.push_back(column_index.GetPrimaryIndex());
	}

	auto &storage = table.GetStorage();
	CreateIndexInput input(TableIOManager::Get(storage), storage.db, IndexConstraintType::PRIMARY,
	                       index_storage_info.name, column_ids, unbound_expressions, index_storage_info,
	                       index_storage_info.options);

	auto index_type = context.db->config.GetIndexTypes().FindByName(ART::TYPE_NAME);
	auto index_instance = index_type->create_instance(input);
	storage.AddIndex(std::move(index_instance));

	catalog.Alter(context, alter_info);
}